

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcUnasSrcCodeBody::~CTcUnasSrcCodeBody(CTcUnasSrcCodeBody *this)

{
  void *in_RDI;
  
  ~CTcUnasSrcCodeBody((CTcUnasSrcCodeBody *)0x289658);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

CTcUnasSrcCodeBody(CTcCodeStream *str,
                       unsigned long code_start_ofs,
                       unsigned long code_end_ofs)
    {
        /* remember the stream */
        str_ = str;

        /* start at the starting offset */
        cur_ofs_ = code_start_ofs;

        /* remember the ending offset */
        end_ofs_ = code_end_ofs;
    }